

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cp.cpp
# Opt level: O1

bool __thiscall CmdCp::CopyFile(CmdCp *this,string *fileFrom,string *fileTo)

{
  pointer pcVar1;
  bool bVar2;
  char cVar3;
  FileType FVar4;
  ostream *poVar5;
  long *plVar6;
  long *plVar7;
  char buf;
  ofstream fout;
  ifstream fin;
  undefined1 *local_450 [2];
  undefined1 local_440 [16];
  long *local_430;
  long local_428;
  long local_420;
  long lStack_418;
  ios_base local_338 [264];
  char local_230 [520];
  
  bVar2 = DirUtils::IsSameDir(fileFrom,fileTo);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"cp: \'",5);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(fileFrom->_M_dataplus)._M_p,
                        fileFrom->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' and \'",7);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(fileTo->_M_dataplus)._M_p,fileTo->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\' are the same file",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    cVar3 = '\0';
  }
  else {
    std::ifstream::ifstream(local_230,(fileFrom->_M_dataplus)._M_p,_S_bin);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"cp: cannot stat \'",0x11);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(fileFrom->_M_dataplus)._M_p,
                          fileFrom->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"\': No such file or directory",0x1c);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      cVar3 = '\0';
    }
    else {
      FVar4 = DirUtils::GetFileType(fileTo);
      if (FVar4 == DU_DIRECTORY) {
        pcVar1 = (fileTo->_M_dataplus)._M_p;
        local_450[0] = local_440;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_450,pcVar1,pcVar1 + fileTo->_M_string_length);
        std::__cxx11::string::append((char *)local_450);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_450,(ulong)(fileFrom->_M_dataplus)._M_p);
        plVar7 = plVar6 + 2;
        if ((long *)*plVar6 == plVar7) {
          local_420 = *plVar7;
          lStack_418 = plVar6[3];
          local_430 = &local_420;
        }
        else {
          local_420 = *plVar7;
          local_430 = (long *)*plVar6;
        }
        local_428 = plVar6[1];
        *plVar6 = (long)plVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)fileTo,(string *)&local_430);
        if (local_430 != &local_420) {
          operator_delete(local_430);
        }
        if (local_450[0] != local_440) {
          operator_delete(local_450[0]);
        }
      }
      std::ofstream::ofstream(&local_430,(fileTo->_M_dataplus)._M_p,_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"cp: cannot regular file \'",0x19);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(fileTo->_M_dataplus)._M_p,
                            fileTo->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\': No such file or directory",0x1c);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      else {
        while( true ) {
          plVar6 = (long *)std::istream::read(local_230,(long)local_450);
          if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
          std::ostream::write((char *)&local_430,(long)local_450);
        }
        std::ifstream::close();
        std::ofstream::close();
      }
      local_430 = _VTT;
      *(undefined8 *)((long)&local_430 + _VTT[-3]) = ___cxa_atexit;
      std::filebuf::~filebuf((filebuf *)&local_428);
      std::ios_base::~ios_base(local_338);
    }
    std::ifstream::~ifstream(local_230);
  }
  return (bool)cVar3;
}

Assistant:

bool CmdCp::CopyFile(string fileFrom, string fileTo){
	if(IsSameDir(fileFrom, fileTo)){
		cout << "cp: '" << fileFrom << "' and '" << fileTo << "' are the same file" << endl;
		return false;
	}
	/* input file */
	ifstream fin(fileFrom.c_str(), ios::binary);
	if(!fin.is_open()){
		cout << "cp: cannot stat '" << fileFrom << "': No such file or directory" << endl;
		return false;
	}
	/* output file */
	if(GetFileType(fileTo) == DU_DIRECTORY){
		fileTo = fileTo + "/" + fileFrom;
	}
	
	ofstream fout(fileTo.c_str(), ios::binary);
	if(!fout.is_open()){
		cout << "cp: cannot regular file '" << fileTo << "': No such file or directory" << endl;
		return false;
	}
	/* copying */
	char buf;
	while(fin.read(&buf, sizeof(buf))){
		fout.write(&buf, sizeof(buf));
	}
	fin.close();
	fout.close();
	return true;
}